

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_704a::createChecksum
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,string *hrp
          ,vector<unsigned_char,_std::allocator<unsigned_char>_> *dp)

{
  uint32_t uVar1;
  size_type i;
  long lVar2;
  byte bVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> c;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  expandHrp((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,hrp);
  cat(&c,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,dp);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&c,(size_type)
                (c.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                (6 - (long)c.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start)));
  uVar1 = polymod(&c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,6,(allocator_type *)&local_38);
  bVar3 = 0x19;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[lVar2] =
         (byte)((uVar1 ^ 0x2bc830a3) >> (bVar3 & 0x1f)) & 0x1f;
    bVar3 = bVar3 - 5;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&c.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char>
    createChecksum(const std::string &hrp, const std::vector<unsigned char> &dp) {
        std::vector<unsigned char> c = cat(expandHrp(hrp), dp);
        c.resize(c.size() + CHECKSUM_LENGTH);
        uint32_t mod = polymod(c) ^ M;
        std::vector<unsigned char> ret(CHECKSUM_LENGTH);
        for(std::vector<unsigned char>::size_type i = 0; i < CHECKSUM_LENGTH; ++i) {
            ret[i] = static_cast<unsigned char>((mod >> (5 * (5 - i))) & 31u);
        }
        return ret;
    }